

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListReader * __thiscall
capnp::_::PointerReader::getList
          (ListReader *__return_storage_ptr__,PointerReader *this,ElementSize expectedElementSize,
          word *defaultValue)

{
  WirePointer *local_48;
  WirePointer *ref;
  word *defaultValue_local;
  ElementSize expectedElementSize_local;
  PointerReader *this_local;
  
  if (this->pointer == (WirePointer *)0x0) {
    local_48 = (WirePointer *)&(anonymous_namespace)::zero;
  }
  else {
    local_48 = this->pointer;
  }
  WireHelpers::readListPointer
            (__return_storage_ptr__,this->segment,this->capTable,local_48,defaultValue,
             expectedElementSize,this->nestingLimit,true);
  return __return_storage_ptr__;
}

Assistant:

ListReader PointerReader::getList(ElementSize expectedElementSize, const word* defaultValue) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readListPointer(
      segment, capTable, ref, defaultValue, expectedElementSize, nestingLimit);
}